

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O2

void Cec2_CollectSuper_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Ptr_t *vSuper,int fFirst,int fUseMuxes)

{
  int iVar1;
  uint *puVar2;
  ulong uVar3;
  bool bVar4;
  
  bVar4 = fFirst == 0;
  do {
    if ((((ulong)pObj & 1) != 0) || (uVar3 = *(ulong *)pObj, (~(uint)uVar3 & 0x9fffffff) == 0))
    goto LAB_0051e234;
    if (bVar4) {
      if (p->pRefs == (int *)0x0) {
        puVar2 = &pObj->Value;
      }
      else {
        iVar1 = Gia_ObjId(p,pObj);
        puVar2 = (uint *)(p->pRefs + iVar1);
      }
      if (1 < (int)*puVar2) {
LAB_0051e234:
        Vec_PtrPushUnique(vSuper,pObj);
        return;
      }
      uVar3 = *(ulong *)pObj;
    }
    if ((fUseMuxes != 0) && ((uVar3 & 0x40000000) != 0)) goto LAB_0051e234;
    Cec2_CollectSuper_rec
              (p,(Gia_Obj_t *)
                 ((ulong)((uint)uVar3 >> 0x1d & 1) | (ulong)(pObj + -(uVar3 & 0x1fffffff))),vSuper,0
               ,fUseMuxes);
    pObj = (Gia_Obj_t *)
           ((ulong)((uint)(*(ulong *)pObj >> 0x3d) & 1) |
           (ulong)(pObj + -(*(ulong *)pObj >> 0x20 & 0x1fffffff)));
    bVar4 = true;
  } while( true );
}

Assistant:

void Cec2_CollectSuper_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Ptr_t * vSuper, int fFirst, int fUseMuxes )
{
    // if the new node is complemented or a PI, another gate begins
    if ( Gia_IsComplement(pObj) || Gia_ObjIsCi(pObj) || 
         (!fFirst && (p->pRefs ? Gia_ObjRefNum(p, pObj) : Gia_ObjValue(pObj)) > 1) || 
         (fUseMuxes && pObj->fMark0) )
    {
        Vec_PtrPushUnique( vSuper, pObj );
        return;
    }
    // go through the branches
    Cec2_CollectSuper_rec( p, Gia_ObjChild0(pObj), vSuper, 0, fUseMuxes );
    Cec2_CollectSuper_rec( p, Gia_ObjChild1(pObj), vSuper, 0, fUseMuxes );
}